

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O2

Float __thiscall pbrt::FloatBilerpTexture::Evaluate(FloatBilerpTexture *this,TextureEvalContext ctx)

{
  undefined1 auVar1 [16];
  anon_class_24_3_48d30edf func;
  Float FVar2;
  undefined1 auVar3 [64];
  initializer_list<float> v;
  span<const_float> v_00;
  array<float,_2> local_a8;
  Tuple2<pbrt::Vector2,_float> local_a0;
  undefined8 local_98;
  Vector2f *local_90;
  undefined8 *local_88;
  undefined1 *local_80;
  undefined8 **ppuStack_78;
  Vector2f **local_70;
  undefined1 local_68 [16];
  float fStack_58;
  float fStack_54;
  Tuple3<pbrt::Vector3,_float> aTStack_50 [4];
  undefined1 extraout_var [56];
  
  local_88 = &local_98;
  ppuStack_78 = &local_88;
  local_90 = (Vector2f *)&local_a0;
  local_80 = local_68;
  local_98 = 0;
  local_70 = &local_90;
  local_a0.x = 0.0;
  local_a0.y = 0.0;
  local_68 = ctx._0_16_;
  fStack_58 = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
  fStack_54 = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_50[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
  aTStack_50[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
  aTStack_50[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_50[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
  aTStack_50[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
  aTStack_50[1].z = ctx.dudx;
  aTStack_50[2].x = ctx.dudy;
  aTStack_50[2].y = ctx.dvdx;
  aTStack_50[2].z = ctx.dvdy;
  aTStack_50[3].x = (float)ctx.faceIndex;
  func.dstdx = (Vector2f **)ppuStack_78;
  func.ctx = (TextureEvalContext *)local_80;
  func.dstdy = local_70;
  auVar3._0_8_ = TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                 ::
                 Dispatch<pbrt::TextureMapping2DHandle::Map(pbrt::TextureEvalContext,pbrt::Vector2<float>*,pbrt::Vector2<float>*)const::_lambda(auto:1)_1_>
                           ((TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                             *)this,func);
  auVar3._8_56_ = extraout_var;
  local_80 = (undefined1 *)vmovlps_avx(auVar3._0_16_);
  v._M_len = 2;
  v._M_array = (iterator)&local_80;
  pstd::array<float,_2>::array(&local_a8,v);
  auVar1._0_4_ = this->v00;
  auVar1._4_4_ = this->v01;
  auVar1._8_4_ = this->v10;
  auVar1._12_4_ = this->v11;
  local_68 = vpermilps_avx(auVar1,0xd8);
  v_00.n = 4;
  v_00.ptr = (float *)local_68;
  FVar2 = Bilerp(local_a8,v_00);
  return FVar2;
}

Assistant:

PBRT_CPU_GPU
    Float Evaluate(TextureEvalContext ctx) const {
        Vector2f dstdx, dstdy;
        Point2f st = mapping.Map(ctx, &dstdx, &dstdy);
        return Bilerp({st[0], st[1]}, {v00, v10, v01, v11});
    }